

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

void vkt::api::anon_unknown_0::addResolveImageWholeArrayImageTests(TestCaseGroup *group)

{
  long lVar1;
  pointer pcVar2;
  TestContext *testCtx;
  ResolveImageToImageTestCase *node;
  pointer __src;
  long *plVar3;
  pointer __dest;
  string *psVar4;
  VkSampleCountFlagBits sampleFlag;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar5;
  uint uVar6;
  _anonymous_namespace_ *this;
  ulong __n;
  long lVar7;
  string description;
  undefined1 local_168 [32];
  ResolveImageToImageTestCase *local_148;
  TestNode *local_140;
  undefined1 local_138 [80];
  pointer local_e8;
  _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  *local_e0;
  Buffer local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  local_a8;
  Data local_88;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_58;
  long local_50;
  long local_48;
  uint local_40;
  
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.size = 0x2500000001;
  uStack_d0 = 0x4000000040;
  local_c8 = 1;
  uStack_c4 = 6;
  uStack_c0 = 1;
  uStack_bc = 0x25;
  local_b8 = 0x4000000040;
  uStack_b0 = 0x700000005;
  uVar6 = 0;
  local_140 = &group->super_TestNode;
  do {
    local_138._0_8_ = &DAT_00000001;
    local_138._12_4_ = 1;
    local_138._16_4_ = 0;
    local_138._20_4_ = 0;
    local_138._24_4_ = 0;
    local_138._28_4_ = 1;
    local_138._32_4_ = 0;
    local_138._40_8_ = 1;
    local_138._48_8_ = 0;
    local_138._56_8_ = 0x4000000040;
    local_138._64_4_ = 1;
    local_138._8_4_ = uVar6;
    local_138._36_4_ = uVar6;
    std::
    vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
    ::push_back(&local_a8,(value_type *)local_138);
    __src = local_a8.
            super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
            ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = uVar6 + 1;
  } while (uVar6 < (uint)uStack_b0);
  local_e8 = local_a8.
             super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  __n = (long)local_a8.
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_a8.
              super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_e0 = (_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
              *)(((long)__n >> 4) * -0x3333333333333333);
  lVar7 = 0;
  uVar5 = extraout_RDX;
  do {
    uVar6 = *(uint *)((long)&api::(anonymous_namespace)::samples + lVar7);
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              ((string *)local_168,(_anonymous_namespace_ *)(ulong)uVar6,
               (VkSampleCountFlagBits)uVar5);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_168,0,(char *)0x0,0xad8e33);
    psVar4 = (string *)(plVar3 + 2);
    if ((string *)*plVar3 == psVar4) {
      pcVar2 = (psVar4->_M_dataplus)._M_p;
      local_138._16_4_ = SUB84(pcVar2,0);
      local_138._20_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
      local_138._24_4_ = (undefined4)plVar3[3];
      local_138._28_4_ = (undefined4)((ulong)plVar3[3] >> 0x20);
      local_138._0_8_ = (string *)(local_138 + 0x10);
    }
    else {
      pcVar2 = (psVar4->_M_dataplus)._M_p;
      local_138._16_4_ = SUB84(pcVar2,0);
      local_138._20_4_ = (undefined4)((ulong)pcVar2 >> 0x20);
      local_138._0_8_ = (string *)*plVar3;
    }
    local_138._8_4_ = (undefined4)plVar3[1];
    local_138._12_4_ = (undefined4)((ulong)plVar3[1] >> 0x20);
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((string *)local_168._0_8_ != (string *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    local_148 = (ResolveImageToImageTestCase *)operator_new(200);
    testCtx = local_140->m_testCtx;
    this = (_anonymous_namespace_ *)(ulong)uVar6;
    api::(anonymous_namespace)::getSampleCountCaseName_abi_cxx11_
              ((string *)local_168,this,sampleFlag);
    local_88._16_8_ = CONCAT44(uStack_c4,local_c8);
    uStack_70 = CONCAT44(uStack_bc,uStack_c0);
    local_68 = local_b8;
    uStack_60 = uStack_b0;
    local_88.buffer.size = (Buffer)(Buffer)local_d8.size;
    local_88._8_8_ = uStack_d0;
    __dest = std::
             _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
             ::_M_allocate(local_e0,(size_t)this);
    lVar1 = (long)__dest + __n;
    local_58 = __dest;
    local_48 = lVar1;
    if (local_e8 != __src) {
      memmove(__dest,__src,__n);
    }
    node = local_148;
    local_50 = lVar1;
    local_40 = uVar6;
    ResolveImageToImageTestCase::ResolveImageToImageTestCase
              (local_148,testCtx,(string *)local_168._0_8_,(string *)local_138._0_8_,
               (TestParams *)&local_88.buffer,COPY_MS_IMAGE_TO_ARRAY_MS_IMAGE);
    tcu::TestNode::addChild(local_140,(TestNode *)node);
    uVar5 = extraout_RDX_00;
    if (__dest != (pointer)0x0) {
      operator_delete(__dest,__n);
      uVar5 = extraout_RDX_01;
    }
    if ((string *)local_168._0_8_ != (string *)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
      uVar5 = extraout_RDX_02;
    }
    if ((string *)local_138._0_8_ != (string *)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_,CONCAT44(local_138._20_4_,local_138._16_4_) + 1);
      uVar5 = extraout_RDX_03;
    }
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x18);
  if (__src != (pointer)0x0) {
    operator_delete(__src,(long)local_a8.
                                super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
  }
  return;
}

Assistant:

void addResolveImageWholeArrayImageTests (tcu::TestCaseGroup* group)
{
	TestParams	params;
	params.src.image.imageType			= VK_IMAGE_TYPE_2D;
	params.src.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.src.image.extent				= defaultExtent;
	params.src.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL;
	params.dst.image.imageType			= VK_IMAGE_TYPE_2D;
	params.dst.image.format				= VK_FORMAT_R8G8B8A8_UNORM;
	params.dst.image.extent				= defaultExtent;
	params.dst.image.extent.depth		= 5u;
	params.dst.image.operationLayout	= VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;

	for (deUint32 layerNdx=0; layerNdx < params.dst.image.extent.depth; ++layerNdx)
	{
		const VkImageSubresourceLayers	sourceLayer	=
		{
			VK_IMAGE_ASPECT_COLOR_BIT,		// VkImageAspectFlags	aspectMask;
			0u,								// uint32_t				mipLevel;
			layerNdx,						// uint32_t				baseArrayLayer;
			1u								// uint32_t				layerCount;
		};

		const VkImageResolve			testResolve	=
		{
			sourceLayer,		// VkImageSubresourceLayers	srcSubresource;
			{0, 0, 0},			// VkOffset3D				srcOffset;
			sourceLayer,		// VkImageSubresourceLayers	dstSubresource;
			{0, 0, 0},			// VkOffset3D				dstOffset;
			defaultExtent,		// VkExtent3D				extent;
		};

		CopyRegion	imageResolve;
		imageResolve.imageResolve	= testResolve;
		params.regions.push_back(imageResolve);
	}

	for (int samplesIndex = 0; samplesIndex < DE_LENGTH_OF_ARRAY(samples); ++samplesIndex)
	{
		params.samples					= samples[samplesIndex];
		const std::string description	= "With " + getSampleCountCaseName(samples[samplesIndex]);
		group->addChild(new ResolveImageToImageTestCase(group->getTestContext(), getSampleCountCaseName(samples[samplesIndex]), description, params, COPY_MS_IMAGE_TO_ARRAY_MS_IMAGE));
	}
}